

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O3

void __thiscall chrono::ChShaft::ChShaft(ChShaft *this)

{
  undefined1 auVar1 [32];
  
  ChObj::ChObj((ChObj *)this);
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = auVar1;
  (this->super_ChPhysicsItem).system = (ChSystem *)auVar1._0_8_;
  (this->super_ChPhysicsItem).vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar1._8_16_;
  (this->super_ChPhysicsItem).cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1._24_8_;
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChShaft_00b21f60;
  (this->super_ChLoadable)._vptr_ChLoadable = (_func_int **)&PTR__ChShaft_00b221a8;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  this->torque = (double)auVar1._0_8_;
  this->pos = (double)auVar1._8_8_;
  this->pos_dt = (double)auVar1._16_8_;
  this->pos_dtdt = (double)auVar1._24_8_;
  this->inertia = 1.0;
  ChVariables::ChVariables(&(this->variables).super_ChVariables,1);
  (this->variables).super_ChVariables._vptr_ChVariables = (_func_int **)&PTR__ChVariables_00b3bb90;
  (this->variables).m_inertia = 1.0;
  (this->variables).m_inv_inertia = 1.0;
  this->max_speed = 10.0;
  this->sleep_time = 0.6;
  this->sleep_minspeed = 0.1;
  this->sleep_minwvel = 0.04;
  this->sleep_starttime = 0.0;
  *(undefined4 *)((long)&this->sleep_starttime + 3) = 0;
  this->use_sleeping = true;
  (this->variables).m_shaft = this;
  return;
}

Assistant:

ChShaft::ChShaft()
    : torque(0),
      pos(0),
      pos_dt(0),
      pos_dtdt(0),
      inertia(1),
      max_speed(10.0f),
      sleep_time(0.6f),
      sleep_minspeed(0.1f),
      sleep_minwvel(0.04f),
      sleep_starttime(0),
      fixed(false),
      limitspeed(false),
      sleeping(false) {
    SetUseSleeping(true);
    variables.SetShaft(this);
}